

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFFundamentalParameterData.cpp
# Opt level: O2

bool __thiscall
DIS::IFFFundamentalParameterData::operator==
          (IFFFundamentalParameterData *this,IFFFundamentalParameterData *rhs)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uchar idx;
  long lVar3;
  undefined4 in_EDX;
  undefined4 uVar4;
  
  auVar1._4_4_ = -(uint)(rhs->_frequency == this->_frequency);
  auVar1._0_4_ = -(uint)(rhs->_erp == this->_erp);
  auVar1._8_4_ = -(uint)(rhs->_pgrf == this->_pgrf);
  auVar1._12_4_ = -(uint)(rhs->_pulseWidth == this->_pulseWidth);
  uVar4 = movmskps(in_EDX,auVar1);
  bVar2 = ((char)uVar4 == '\x0f' && this->_applicableModes == rhs->_applicableModes) &&
          this->_burstLength == rhs->_burstLength;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    bVar2 = (bool)(bVar2 & this->_systemSpecificData[lVar3] == rhs->_systemSpecificData[lVar3]);
  }
  return bVar2;
}

Assistant:

bool IFFFundamentalParameterData::operator ==(const IFFFundamentalParameterData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_erp == rhs._erp) ) ivarsEqual = false;
     if( ! (_frequency == rhs._frequency) ) ivarsEqual = false;
     if( ! (_pgrf == rhs._pgrf) ) ivarsEqual = false;
     if( ! (_pulseWidth == rhs._pulseWidth) ) ivarsEqual = false;
     if( ! (_burstLength == rhs._burstLength) ) ivarsEqual = false;
     if( ! (_applicableModes == rhs._applicableModes) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 3; idx++)
     {
          if(!(_systemSpecificData[idx] == rhs._systemSpecificData[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }